

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_alloc_display(EditLine *el)

{
  wint_t **ppwVar1;
  EditLine *el_local;
  
  ppwVar1 = terminal_alloc_buffer(el);
  el->el_display = ppwVar1;
  if (el->el_display != (wint_t **)0x0) {
    ppwVar1 = terminal_alloc_buffer(el);
    el->el_vdisplay = ppwVar1;
    if (el->el_vdisplay != (wint_t **)0x0) {
      return L'\0';
    }
  }
  terminal_free_display(el);
  return L'\xffffffff';
}

Assistant:

static int
terminal_alloc_display(EditLine *el)
{
	el->el_display = terminal_alloc_buffer(el);
	if (el->el_display == NULL)
		goto done;
	el->el_vdisplay = terminal_alloc_buffer(el);
	if (el->el_vdisplay == NULL)
		goto done;
	return 0;
done:
	terminal_free_display(el);
	return -1;
}